

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementsTable.cpp
# Opt level: O0

void __thiscall OpenMD::ElementsTable::Init(ElementsTable *this)

{
  bool bVar1;
  uint uVar2;
  char *pcVar3;
  ifstrstream *piVar4;
  undefined8 uVar5;
  long *plVar6;
  int __fd;
  undefined1 *puVar7;
  byte *in_RDI;
  ifstrstream *efStream;
  string filename_;
  char charBuffer [32768];
  char *tempPath;
  undefined4 in_stack_ffffffffffff7f00;
  undefined2 in_stack_ffffffffffff7f04;
  undefined1 in_stack_ffffffffffff7f06;
  undefined1 in_stack_ffffffffffff7f07;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffff7f08;
  undefined7 in_stack_ffffffffffff7f20;
  undefined1 in_stack_ffffffffffff7f27;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffff7f28;
  string *this_00;
  allocator<char> *in_stack_ffffffffffff7f30;
  char *in_stack_ffffffffffff7f38;
  undefined7 in_stack_ffffffffffff7f40;
  undefined1 in_stack_ffffffffffff7f47;
  string local_8098 [32];
  string local_8078 [32];
  ifstrstream *local_8058;
  allocator<char> local_8039;
  string local_8038 [32];
  undefined1 local_8018 [400];
  char *in_stack_ffffffffffff8178;
  ElementsTable *in_stack_ffffffffffff8180;
  
  if ((*in_RDI & 1) == 0) {
    *in_RDI = 1;
    pcVar3 = getenv("FORCE_PARAM_PATH");
    if (pcVar3 == (char *)0x0) {
      std::__cxx11::string::operator=((string *)(in_RDI + 0x28),"/usr/local/openmd/forceFields");
    }
    else {
      std::__cxx11::string::operator=((string *)(in_RDI + 0x28),pcVar3);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffff7f47,in_stack_ffffffffffff7f40),
               in_stack_ffffffffffff7f38,in_stack_ffffffffffff7f30);
    std::allocator<char>::~allocator(&local_8039);
    piVar4 = (ifstrstream *)operator_new(0x278);
    ifstrstream::ifstrstream
              ((ifstrstream *)CONCAT17(in_stack_ffffffffffff7f27,in_stack_ffffffffffff7f20));
    local_8058 = piVar4;
    pcVar3 = (char *)std::__cxx11::string::c_str();
    ifstrstream::open(piVar4,pcVar3,8,0);
    __fd = (int)pcVar3;
    bVar1 = ifstrstream::is_open((ifstrstream *)0x3cc51b);
    if (!bVar1) {
      std::operator+(in_stack_ffffffffffff7f28,
                     (char *)CONCAT17(in_stack_ffffffffffff7f27,in_stack_ffffffffffff7f20));
      std::operator+(in_stack_ffffffffffff7f08,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_ffffffffffff7f07,
                              CONCAT16(in_stack_ffffffffffff7f06,
                                       CONCAT24(in_stack_ffffffffffff7f04,in_stack_ffffffffffff7f00)
                                      )));
      this_00 = local_8078;
      std::__cxx11::string::operator=(local_8038,this_00);
      std::__cxx11::string::~string(this_00);
      std::__cxx11::string::~string(local_8098);
      piVar4 = local_8058;
      pcVar3 = (char *)std::__cxx11::string::c_str();
      ifstrstream::open(piVar4,pcVar3,8,0);
      __fd = (int)pcVar3;
      bVar1 = ifstrstream::is_open((ifstrstream *)0x3cc5d4);
      if (!bVar1) {
        uVar5 = std::__cxx11::string::c_str();
        __fd = 2000;
        snprintf(painCave.errMsg,2000,
                 "Error opening the ElementsTable file:\n\t%s\n\tHave you tried setting the FORCE_PARAM_PATH environment variable?\n"
                 ,uVar5);
        painCave.severity = 1;
        painCave.isFatal = 1;
        simError();
      }
    }
    bVar1 = ifstrstream::is_open((ifstrstream *)0x3cc6d5);
    if (bVar1) {
      while( true ) {
        puVar7 = local_8018;
        plVar6 = (long *)std::istream::getline((char *)local_8058,(long)puVar7);
        __fd = (int)puVar7;
        bVar1 = std::ios::operator_cast_to_bool((ios *)((long)plVar6 + *(long *)(*plVar6 + -0x18)));
        if (!bVar1) break;
        ParseLine(in_stack_ffffffffffff8180,in_stack_ffffffffffff8178);
      }
    }
    bVar1 = ifstrstream::is_open((ifstrstream *)0x3cc751);
    if (bVar1) {
      ifstrstream::close(local_8058,__fd);
    }
    uVar2 = GetSize((ElementsTable *)0x3cc77c);
    if (uVar2 == 0) {
      uVar5 = std::__cxx11::string::c_str();
      snprintf(painCave.errMsg,2000,"ElementsTable error.\n\tCannot initialize database %s \n",uVar5
              );
      painCave.isFatal = 0;
      simError();
    }
    std::__cxx11::string::~string(local_8038);
  }
  return;
}

Assistant:

void ElementsTable::Init() {
    if (init_) return;
    init_ = true;

    char* tempPath;
    char charBuffer[BUFF_SIZE];
    tempPath = getenv("FORCE_PARAM_PATH");

    if (tempPath == NULL) {
      // convert a macro from compiler to a string in c++
      STR_DEFINE(dir_, FRC_PATH);
    } else {
      dir_ = tempPath;
    }

    std::string filename_("element.txt");

    ifstrstream* efStream = new ifstrstream();

    // Try to open the elements file in current directory first
    efStream->open(filename_.c_str());

    if (!efStream->is_open()) {
      // If current directory does not contain the elements file,
      // try to open it in ffPath_:
      filename_ = dir_ + FILE_SEP_CHAR + filename_;
      efStream->open(filename_.c_str());

      if (!efStream->is_open()) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "Error opening the ElementsTable file:\n"
                 "\t%s\n"
                 "\tHave you tried setting the FORCE_PARAM_PATH environment "
                 "variable?\n",
                 filename_.c_str());
        painCave.severity = OPENMD_ERROR;
        painCave.isFatal  = 1;
        simError();
      }
    }

    if (efStream->is_open()) {
      while (efStream->getline(charBuffer, BUFF_SIZE))
        ParseLine(charBuffer);
    }

    if (efStream->is_open()) efStream->close();

    if (GetSize() == 0) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "ElementsTable error.\n"
               "\tCannot initialize database %s \n",
               filename_.c_str());
      painCave.isFatal = 0;
      simError();
    }
  }